

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

Vec_Int_t * Gia_ManIffSelect(Iff_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  int iVar7;
  
  p_00 = Vec_IntAlloc(p->pGia->nObjs);
  iVar7 = 0;
  Vec_IntPush(p_00,0);
  Gia_ManIncrementTravId(p->pGia);
  Gia_ObjSetTravIdCurrentId(p->pGia,0);
  while( true ) {
    pGVar1 = p->pGia;
    pVVar2 = pGVar1->vCis;
    if (pVVar2->nSize <= iVar7) break;
    iVar4 = Vec_IntEntry(pVVar2,iVar7);
    pGVar6 = Gia_ManObj(pGVar1,iVar4);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    pGVar1 = p->pGia;
    iVar4 = Gia_ObjId(pGVar1,pGVar6);
    if (pGVar1->nTravIdsAlloc <= iVar4) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = pGVar1->nTravIds;
    piVar3 = pGVar1->pTravIds;
    iVar5 = Gia_ObjId(pGVar1,pGVar6);
    piVar3[iVar5] = iVar4;
    iVar7 = iVar7 + 1;
  }
  iVar7 = 0;
  while( true ) {
    pGVar1 = p->pGia;
    pVVar2 = pGVar1->vCos;
    if (pVVar2->nSize <= iVar7) {
      return p_00;
    }
    iVar4 = Vec_IntEntry(pVVar2,iVar7);
    pGVar6 = Gia_ManObj(pGVar1,iVar4);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjFaninId0p(p->pGia,pGVar6);
    Gia_ManIffSelect_rec(p,iVar4,p_00);
    iVar7 = iVar7 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManIffSelect( Iff_Man_t * p )
{
    Vec_Int_t * vPacking;
    Gia_Obj_t * pObj; int i;
    vPacking = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    Vec_IntPush( vPacking, 0 );
    // mark const0 and PIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrentId( p->pGia, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pObj );
    // recursively collect internal nodes
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ManIffSelect_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), vPacking );
    return vPacking;
}